

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cc
# Opt level: O3

void board::Board::INIT(void)

{
  uint uVar1;
  long lVar2;
  unsigned_long uVar3;
  result_type rVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  uint64_t uVar10;
  ulong uVar11;
  ulong uVar12;
  int rank;
  long lVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  undefined4 uVar20;
  uint uVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  ulong uVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  uniform_int_distribution<unsigned_long> dist;
  mt19937_64 e2;
  random_device rd;
  uniform_int_distribution<unsigned_long> local_1d90;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_1d80;
  random_device local_13b8;
  
  std::random_device::random_device(&local_13b8);
  uVar1 = std::random_device::_M_getval();
  local_1d80._M_x[0] = (unsigned_long)uVar1;
  lVar2 = 1;
  uVar6 = local_1d80._M_x[0];
  do {
    uVar6 = (uVar6 >> 0x3e ^ uVar6) * 0x5851f42d4c957f2d + lVar2;
    local_1d80._M_x[lVar2] = uVar6;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x138);
  local_1d80._M_p = 0x138;
  uVar3 = llround(2.305843009213694e+18);
  local_1d90._M_param._M_b = llround(4.611686018427388e+18);
  lVar2 = 0;
  local_1d90._M_param._M_a = uVar3;
  do {
    lVar13 = lVar2 + 0x3c0;
    lVar8 = 0;
    do {
      rVar4 = std::uniform_int_distribution<unsigned_long>::operator()
                        (&local_1d90,&local_1d80,&local_1d90._M_param);
      *(result_type *)((long)PIECE_KEYS[0] + lVar2 + lVar8) = rVar4;
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x3c0);
    lVar2 = lVar13;
  } while (lVar13 != 0x30c0);
  rVar4 = std::uniform_int_distribution<unsigned_long>::operator()
                    (&local_1d90,&local_1d80,&local_1d90._M_param);
  auVar15._8_4_ = (int)rVar4;
  auVar15._0_8_ = rVar4;
  auVar15._12_4_ = (int)(rVar4 >> 0x20);
  lVar2 = 0;
  do {
    *(undefined1 (*) [16])((long)CASTLE_KEYS + lVar2) = auVar15;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x80);
  SIDE_KEY = std::uniform_int_distribution<unsigned_long>::operator()
                       (&local_1d90,&local_1d80,&local_1d90._M_param);
  FILE_MASK[0] = 0;
  FILE_MASK[1] = 0;
  FILE_MASK[2] = 0;
  FILE_MASK[3] = 0;
  FILE_MASK[4] = 0;
  FILE_MASK[5] = 0;
  FILE_MASK[6] = 0;
  FILE_MASK[7] = 0;
  RANK_MASK[0] = 0;
  RANK_MASK[1] = 0;
  RANK_MASK[2] = 0;
  RANK_MASK[3] = 0;
  RANK_MASK[4] = 0;
  RANK_MASK[5] = 0;
  RANK_MASK[6] = 0;
  RANK_MASK[7] = 0;
  lVar2 = 0;
  memset(PASSED_PAWN_MASK,0,0x400);
  memset(ISOLATED_PAWN_MASK,0,0x200);
  do {
    uVar10 = RANK_MASK[lVar2];
    uVar6 = 0;
    auVar16._8_4_ = (int)lVar2;
    auVar16._0_8_ = lVar2;
    auVar16._12_4_ = (int)((ulong)lVar2 >> 0x20);
    lVar7 = 0;
    lVar8 = 0;
    lVar13 = 1;
    do {
      lVar17 = lVar13 + auVar16._8_8_ * 8;
      uVar18 = 1L << lVar8 + lVar2 * 8;
      auVar30._8_4_ = (undefined4)lVar17;
      auVar30._12_4_ = (undefined4)((ulong)lVar17 >> 0x20);
      auVar30._0_8_ = lVar17;
      uVar19 = 1L << auVar30._8_8_;
      uVar10 = uVar10 | uVar18;
      uVar6 = uVar6 | uVar19;
      *(ulong *)((long)FILE_MASK + lVar7) = uVar18 | *(ulong *)((long)FILE_MASK + lVar7);
      *(ulong *)((long)FILE_MASK + lVar7 + 8) = uVar19 | *(ulong *)((long)FILE_MASK + lVar7 + 8);
      lVar8 = lVar8 + 2;
      lVar13 = lVar13 + 2;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x40);
    RANK_MASK[lVar2] = uVar6 | uVar10;
    auVar16 = _DAT_001312a0;
    auVar15 = _DAT_00131290;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  uVar6 = 7;
  uVar1 = 0xfffffff7;
  uVar18 = 9;
  iVar9 = -1;
  lVar2 = 0;
  uVar19 = 0;
  do {
    uVar12 = 0x38;
    if (0x38 < uVar6) {
      uVar12 = uVar6;
    }
    uVar27 = 0xf;
    if ((long)uVar19 < 0xf) {
      uVar27 = uVar19;
    }
    if (uVar19 < 0x38) {
      uVar10 = PASSED_PAWN_MASK[0][uVar19];
      uVar5 = uVar19;
      do {
        uVar10 = uVar10 | 0x100L << ((byte)uVar5 & 0x3f);
        bVar14 = uVar5 < 0x30;
        uVar5 = uVar5 + 8;
      } while (bVar14);
      PASSED_PAWN_MASK[0][uVar19] = uVar10;
      if (7 < uVar19) goto LAB_0012d6be;
    }
    else {
LAB_0012d6be:
      uVar11 = uVar6 - uVar27 >> 3;
      auVar28._8_4_ = (int)uVar19;
      auVar28._0_8_ = uVar19;
      auVar28._12_4_ = (int)(uVar19 >> 0x20);
      lVar13 = auVar28._8_8_ + -8;
      uVar20 = (undefined4)uVar11;
      uVar21 = (uint)(uVar6 - uVar27 >> 0x23);
      auVar23._4_4_ = uVar21;
      auVar23._0_4_ = uVar20;
      auVar23._8_4_ = uVar20;
      auVar23._12_4_ = uVar21;
      lVar8 = 2;
      uVar27 = uVar19;
      uVar10 = PASSED_PAWN_MASK[1][uVar19];
      uVar5 = 0;
      do {
        uVar36 = uVar5;
        uVar22 = uVar10;
        uVar10 = 1L << (uVar27 + 0xfffffff8 & 0xffffffff) | uVar22;
        uVar5 = 1L << (lVar13 + 0xfffffff8U >> 0x20) | uVar36;
        uVar27 = uVar27 - 0x10;
        lVar13 = lVar13 + -0x10;
        lVar7 = (uVar11 + 2 & 0xfffffffffffffffe) + lVar8;
        lVar8 = lVar8 + -2;
      } while (lVar7 != 4);
      lVar8 = -lVar8;
      auVar29._8_4_ = (int)lVar8;
      auVar29._0_8_ = lVar8;
      auVar29._12_4_ = (int)((ulong)lVar8 >> 0x20);
      auVar23 = auVar23 ^ auVar16;
      auVar30 = (auVar29 | auVar15) ^ auVar16;
      iVar37 = -(uint)(auVar23._0_4_ < auVar30._0_4_);
      iVar38 = -(uint)(auVar23._4_4_ < auVar30._4_4_);
      iVar39 = -(uint)(auVar23._8_4_ < auVar30._8_4_);
      iVar40 = -(uint)(auVar23._12_4_ < auVar30._12_4_);
      auVar41._4_4_ = iVar37;
      auVar41._0_4_ = iVar37;
      auVar41._8_4_ = iVar39;
      auVar41._12_4_ = iVar39;
      iVar37 = -(uint)(auVar30._4_4_ == auVar23._4_4_);
      iVar39 = -(uint)(auVar30._12_4_ == auVar23._12_4_);
      auVar24._4_4_ = iVar37;
      auVar24._0_4_ = iVar37;
      auVar24._8_4_ = iVar39;
      auVar24._12_4_ = iVar39;
      auVar31._4_4_ = iVar38;
      auVar31._0_4_ = iVar38;
      auVar31._8_4_ = iVar40;
      auVar31._12_4_ = iVar40;
      auVar31 = auVar31 | auVar24 & auVar41;
      uVar27 = auVar31._0_8_;
      uVar11 = auVar31._8_8_;
      PASSED_PAWN_MASK[1][uVar19] =
           ~uVar11 & uVar5 | uVar36 & uVar11 | ~uVar27 & uVar10 | uVar22 & uVar27;
    }
    uVar27 = (ulong)uVar1;
    if ((0xfefefefefefefefeU >> (uVar19 & 0x3f) & 1) != 0) {
      ISOLATED_PAWN_MASK[uVar19] = ISOLATED_PAWN_MASK[uVar19] | FILE_MASK[FILES[uVar19] - 1];
      if (uVar19 < 0x39) {
        auVar32._8_4_ = (int)uVar6;
        auVar32._0_8_ = uVar6;
        auVar32._12_4_ = (int)(uVar6 >> 0x20);
        auVar33._8_8_ = auVar32._8_8_ + 8;
        auVar33._0_8_ = uVar6;
        uVar20 = (undefined4)(uVar12 - uVar19 >> 3);
        uVar21 = (uint)(uVar12 - uVar19 >> 0x23);
        auVar25._4_4_ = uVar21;
        auVar25._0_4_ = uVar20;
        auVar25._8_4_ = uVar20;
        auVar25._12_4_ = uVar21;
        lVar8 = 2;
        uVar10 = PASSED_PAWN_MASK[0][uVar19];
        uVar5 = 0;
        do {
          uVar22 = uVar5;
          uVar11 = uVar10;
          lVar13 = auVar33._8_8_;
          auVar42._8_4_ = auVar33._8_4_;
          auVar42._0_8_ = lVar13;
          auVar42._12_4_ = auVar33._12_4_;
          uVar10 = 1L << auVar33._0_8_ | uVar11;
          uVar5 = 1L << auVar42._8_8_ | uVar22;
          auVar33._0_8_ = auVar33._0_8_ + 0x10;
          auVar33._8_8_ = lVar13 + 0x10;
          lVar13 = ((lVar2 + uVar12 >> 3) + 2 & 0xfffffffffffffffe) + lVar8;
          lVar8 = lVar8 + -2;
        } while (lVar13 != 4);
        lVar8 = -lVar8;
        auVar34._8_4_ = (int)lVar8;
        auVar34._0_8_ = lVar8;
        auVar34._12_4_ = (int)((ulong)lVar8 >> 0x20);
        auVar25 = auVar25 ^ auVar16;
        auVar30 = (auVar34 | auVar15) ^ auVar16;
        iVar37 = -(uint)(auVar25._0_4_ < auVar30._0_4_);
        iVar38 = -(uint)(auVar25._4_4_ < auVar30._4_4_);
        iVar39 = -(uint)(auVar25._8_4_ < auVar30._8_4_);
        iVar40 = -(uint)(auVar25._12_4_ < auVar30._12_4_);
        auVar43._4_4_ = iVar37;
        auVar43._0_4_ = iVar37;
        auVar43._8_4_ = iVar39;
        auVar43._12_4_ = iVar39;
        iVar37 = -(uint)(auVar30._4_4_ == auVar25._4_4_);
        iVar39 = -(uint)(auVar30._12_4_ == auVar25._12_4_);
        auVar26._4_4_ = iVar37;
        auVar26._0_4_ = iVar37;
        auVar26._8_4_ = iVar39;
        auVar26._12_4_ = iVar39;
        auVar35._4_4_ = iVar38;
        auVar35._0_4_ = iVar38;
        auVar35._8_4_ = iVar40;
        auVar35._12_4_ = iVar40;
        auVar35 = auVar35 | auVar26 & auVar43;
        uVar12 = auVar35._0_8_;
        uVar36 = auVar35._8_8_;
        PASSED_PAWN_MASK[0][uVar19] =
             ~uVar36 & uVar5 | uVar22 & uVar36 | ~uVar12 & uVar10 | uVar11 & uVar12;
        if (uVar19 < 9) goto LAB_0012d8fd;
      }
      uVar10 = PASSED_PAWN_MASK[1][uVar19];
      uVar12 = uVar27;
      iVar37 = iVar9;
      do {
        uVar10 = uVar10 | 1L << (uVar12 & 0x3f);
        uVar12 = uVar12 - 8;
        iVar37 = iVar37 + -8;
      } while (7 < iVar37);
      PASSED_PAWN_MASK[1][uVar19] = uVar10;
    }
LAB_0012d8fd:
    if ((0x7f7f7f7f7f7f7f7fU >> (uVar19 & 0x3f) & 1) != 0) {
      ISOLATED_PAWN_MASK[uVar19] = ISOLATED_PAWN_MASK[uVar19] | FILE_MASK[(long)FILES[uVar19] + 1];
      if (uVar19 < 0x37) {
        uVar10 = PASSED_PAWN_MASK[0][uVar19];
        uVar12 = uVar18;
        do {
          uVar10 = uVar10 | 1L << (uVar12 & 0x3f);
          bVar14 = uVar12 < 0x38;
          uVar12 = uVar12 + 8;
        } while (bVar14);
        PASSED_PAWN_MASK[0][uVar19] = uVar10;
        if (uVar19 < 9) goto LAB_0012d96c;
      }
      uVar10 = PASSED_PAWN_MASK[1][uVar19];
      iVar37 = iVar9;
      do {
        uVar10 = uVar10 | 1L << (uVar27 & 0x3f);
        uVar27 = uVar27 - 8;
        iVar37 = iVar37 + -8;
      } while (7 < iVar37);
      PASSED_PAWN_MASK[1][uVar19] = uVar10;
    }
LAB_0012d96c:
    uVar19 = uVar19 + 1;
    uVar6 = uVar6 + 1;
    uVar1 = uVar1 + 1;
    uVar18 = uVar18 + 1;
    lVar2 = lVar2 + -1;
    iVar9 = iVar9 + 1;
    if (uVar19 == 0x40) {
      std::random_device::_M_fini();
      return;
    }
  } while( true );
}

Assistant:

void board::Board::INIT()
{
    // Zobrist hash keys
    std::random_device rd;
    std::mt19937_64 e2(rd());
    std::uniform_int_distribution<uint64_t> dist(std::llround(std::pow(2, 61)), std::llround(std::pow(2, 62)));
    for (auto& i : PIECE_KEYS) {
        for (auto& j : i) {
            j = dist(e2);
        }
    }
    std::fill(std::begin(CASTLE_KEYS), std::end(CASTLE_KEYS), dist(e2));
    SIDE_KEY = dist(e2);
    // Bitmasks
    int square;
    int tSquare;
    for (int i = 0; i < 8; i++) {
        FILE_MASK[i] = 0ULL;
        RANK_MASK[i] = 0ULL;
    }
    for (int i = 0; i < 64; i++) {
        PASSED_PAWN_MASK[0][i] = 0ULL;
        PASSED_PAWN_MASK[1][i] = 0ULL;
        ISOLATED_PAWN_MASK[i] = 0ULL;
    }
    for (int rank = RANK_1; rank <= RANK_8; rank++) {
        for (int file = FILE_A; file <= FILE_H; file++) {
            square = rank * 8 + file;
            FILE_MASK[file] |= (1ULL << square);
            RANK_MASK[rank] |= (1ULL << square);
        }
    }
    for (square = 0; square < 64; square++) {
        tSquare = square + 8;
        while (tSquare < 64) {
            PASSED_PAWN_MASK[WHITE][square] |= (1ULL << tSquare);
            tSquare += 8;
        }
        tSquare = square - 8;
        while (tSquare >= 0) {
            PASSED_PAWN_MASK[BLACK][square] |= (1ULL << tSquare);
            tSquare -= 8;
        }
        if (Board::FILES[square] > FILE_A) {
            ISOLATED_PAWN_MASK[square] |= FILE_MASK[Board::FILES[square] - 1];
            tSquare = square + 7;
            while (tSquare < 64) {
                PASSED_PAWN_MASK[WHITE][square] |= (1ULL << tSquare);
                tSquare += 8;
            }
            tSquare = square - 9;
            while (tSquare >= 0) {
                PASSED_PAWN_MASK[BLACK][square] |= (1ULL << tSquare);
                tSquare -= 8;
            }
        }
        if (Board::FILES[square] < FILE_H) {
            ISOLATED_PAWN_MASK[square] |= FILE_MASK[Board::FILES[square] + 1];
            tSquare = square + 9;
            while (tSquare < 64) {
                PASSED_PAWN_MASK[WHITE][square] |= (1ULL << tSquare);
                tSquare += 8;
            }
            tSquare = square - 9;
            while (tSquare >= 0) {
                PASSED_PAWN_MASK[BLACK][square] |= (1ULL << tSquare);
                tSquare -= 8;
            }
        }
    }
}